

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintSupport(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  char *pcVar3;
  uint local_48;
  uint local_44;
  int fVeryVerbose;
  int fVerbose;
  int fStruct;
  int c;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vSuppFun;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  bVar1 = true;
  local_44 = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
LAB_00215a2c:
  iVar2 = Extra_UtilGetopt(argc,argv,"svwh");
  if (iVar2 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else if (bVar1) {
      Abc_NtkPrintStrSupports(pNtk_00,local_48);
      pAbc_local._4_4_ = 0;
    }
    else {
      iVar2 = Abc_NtkIsComb(pNtk_00);
      if (iVar2 == 0) {
        Abc_Print(-1,"This command works only for combinational networks (run \"comb\").\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar2 = Abc_NtkIsStrash(pNtk_00);
        if (iVar2 == 0) {
          Abc_Print(-1,"This command works only for AIGs (run \"strash\").\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          p = Sim_ComputeFunSupp(pNtk_00,local_44);
          if (*p->pArray != (void *)0x0) {
            free(*p->pArray);
            *p->pArray = (void *)0x0;
          }
          Vec_PtrFree(p);
          pAbc_local._4_4_ = 0;
        }
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 0x68:
    break;
  default:
    break;
  case 0x73:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_00215a2c;
  case 0x76:
    local_44 = local_44 ^ 1;
    goto LAB_00215a2c;
  case 0x77:
    goto switchD_00215a6a_caseD_77;
  }
  Abc_Print(-2,"usage: print_supp [-svwh]\n");
  Abc_Print(-2,"\t        prints the supports of the CO nodes\n");
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-s    : toggle printing structural support only [default = %s].\n",pcVar3);
  pcVar3 = "no";
  if (local_44 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar3);
  pcVar3 = "no";
  if (local_48 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-w    : enable printing CI/CO dependency matrix [default = %s].\n",pcVar3);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
switchD_00215a6a_caseD_77:
  local_48 = local_48 ^ 1;
  goto LAB_00215a2c;
}

Assistant:

int Abc_CommandPrintSupport( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Ptr_t * vSuppFun;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fStruct;
    int fVerbose;
    int fVeryVerbose;
    extern Vec_Ptr_t * Sim_ComputeFunSupp( Abc_Ntk_t * pNtk, int fVerbose );
    extern void Abc_NtkPrintStrSupports( Abc_Ntk_t * pNtk, int fMatrix );

    // set defaults
    fStruct = 1;
    fVerbose = 0;
    fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fStruct ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // print support information
    if ( fStruct )
    {
        Abc_NtkPrintStrSupports( pNtk, fVeryVerbose );
        return 0;
    }

    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "This command works only for combinational networks (run \"comb\").\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    vSuppFun = Sim_ComputeFunSupp( pNtk, fVerbose );
    ABC_FREE( vSuppFun->pArray[0] );
    Vec_PtrFree( vSuppFun );
    return 0;

usage:
    Abc_Print( -2, "usage: print_supp [-svwh]\n" );
    Abc_Print( -2, "\t        prints the supports of the CO nodes\n" );
    Abc_Print( -2, "\t-s    : toggle printing structural support only [default = %s].\n", fStruct? "yes": "no" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w    : enable printing CI/CO dependency matrix [default = %s].\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}